

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O1

RecyclableObject * __thiscall
Js::LiteralStringWithPropertyStringPtr::CloneToScriptContext
          (LiteralStringWithPropertyStringPtr *this,ScriptContext *requestContext)

{
  PropertyRecord *propertyRecord;
  PropertyString *pPVar1;
  RecyclableObject *pRVar2;
  
  propertyRecord = (this->propertyRecord).ptr;
  if (propertyRecord != (PropertyRecord *)0x0) {
    pPVar1 = ScriptContext::GetPropertyString(requestContext,propertyRecord);
    return (RecyclableObject *)pPVar1;
  }
  pRVar2 = JavascriptString::CloneToScriptContext((JavascriptString *)this,requestContext);
  return pRVar2;
}

Assistant:

RecyclableObject* LiteralStringWithPropertyStringPtr::CloneToScriptContext(ScriptContext* requestContext)
    {
        if (this->propertyRecord == nullptr)
        {
            // Without a property record, we can safely multi-reference the underlying buffer. Assertions in
            // the constructor of LiteralString will verify this.
            return __super::CloneToScriptContext(requestContext);
        }

        // We have a property record, so go ahead and make this be a property string in the request context.
        // The strings in both contexts will refer to the same property record, since property records are
        // shared among all script contexts on a thead.
        return requestContext->GetPropertyString(this->propertyRecord);
    }